

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqmodules.cpp
# Opt level: O3

void __thiscall SqModules::resolveFileName(SqModules *this,char *requested_fn,string *res)

{
  pointer pbVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  pointer pcVar5;
  vector<char,_std::allocator<char>_> scriptPathBuf;
  vector<char,_std::allocator<char>_> local_38;
  
  res->_M_string_length = 0;
  *(res->_M_dataplus)._M_p = '\0';
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  pbVar1 = (this->runningScripts).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->runningScripts).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pbVar1) {
    std::vector<char,_std::allocator<char>_>::resize(&local_38,pbVar1[-1]._M_string_length + 2);
    dd_get_fname_location
              (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,pbVar1[-1]._M_dataplus._M_p);
    dd_append_slash_c(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    sVar3 = strlen(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
    sVar4 = strlen(requested_fn);
    std::vector<char,_std::allocator<char>_>::resize(&local_38,sVar3 + sVar4 + 1);
    strcpy(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start + sVar3,requested_fn);
    dd_simplify_fname_c(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
    sVar3 = strlen(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
    std::vector<char,_std::allocator<char>_>::resize(&local_38,sVar3 + 1);
    iVar2 = access(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,0);
    if (iVar2 == 0) {
      pcVar5 = (res->_M_dataplus)._M_p + res->_M_string_length;
      std::__cxx11::string::
      _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)res,pcVar5,pcVar5,
                 local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
  }
  if (res->_M_string_length == 0) {
    sVar3 = strlen(requested_fn);
    std::vector<char,_std::allocator<char>_>::resize(&local_38,sVar3 + 1);
    strcpy(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start,requested_fn);
    dd_simplify_fname_c(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
    pcVar5 = (res->_M_dataplus)._M_p + res->_M_string_length;
    std::__cxx11::string::
    _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)res,pcVar5,pcVar5,
               local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SqModules::resolveFileName(const char *requested_fn, string &res)
{
  res.clear();

  std::vector<char> scriptPathBuf;

  // try relative path first
  if (!runningScripts.empty())
  {
    const string &curFile = runningScripts.back();
    scriptPathBuf.resize(curFile.length()+2);
    dd_get_fname_location(&scriptPathBuf[0], curFile.c_str());
    dd_append_slash_c(&scriptPathBuf[0]);
    size_t locationLen = strlen(&scriptPathBuf[0]);
    size_t reqFnLen = strlen(requested_fn);
    scriptPathBuf.resize(locationLen + reqFnLen + 1);
    strcpy(&scriptPathBuf[locationLen], requested_fn);
    dd_simplify_fname_c(&scriptPathBuf[0]);
    scriptPathBuf.resize(strlen(&scriptPathBuf[0])+1);
    bool exists = _access(&scriptPathBuf[0], 0) == 0;
    if (exists)
      res.insert(res.end(), scriptPathBuf.begin(), scriptPathBuf.end());
  }

  if (res.empty())
  {
    scriptPathBuf.resize(strlen(requested_fn)+1);
    strcpy(&scriptPathBuf[0], requested_fn);
    dd_simplify_fname_c(&scriptPathBuf[0]);
    res.insert(res.end(), scriptPathBuf.begin(), scriptPathBuf.end());
  }
}